

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QMainWindowLayoutState::unplug
          (QMainWindowLayoutState *this,QList<int> *path,QMainWindowLayoutState *other)

{
  long lVar1;
  int *piVar2;
  qsizetype in_RDX;
  QList<int> *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<int> *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffffa0;
  int iVar3;
  QLayoutItem *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first(in_stack_ffffffffffffff80);
  iVar3 = *piVar2;
  if (iVar3 == 0) {
    QList<int>::mid(in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffa0);
    local_40 = QToolBarAreaLayout::unplug
                         ((QToolBarAreaLayout *)this,path,(QToolBarAreaLayout *)other);
    QList<int>::~QList((QList<int> *)0x5f4979);
  }
  else if (iVar3 == 1) {
    QList<int>::mid(in_RSI,in_RDX,CONCAT44(1,in_stack_ffffffffffffffa0));
    local_40 = QDockAreaLayout::unplug
                         ((QDockAreaLayout *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),in_RDI);
    QList<int>::~QList((QList<int> *)0x5f49cb);
  }
  else {
    local_40 = (QLayoutItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::unplug(const QList<int> &path, QMainWindowLayoutState *other)
{
    int i = path.first();

#if !QT_CONFIG(toolbar)
    Q_UNUSED(other);
#else
    if (i == 0)
        return toolBarAreaLayout.unplug(path.mid(1), other ? &other->toolBarAreaLayout : nullptr);
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.unplug(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}